

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_float<char,fmt::v10::appender,long_double>
                   (appender out,longdouble value,format_specs<char> specs,locale_ref loc)

{
  locale_ref loc_00;
  string_view bytes;
  appender out_00;
  appender out_01;
  format_specs<char> specs_00;
  float_specs specs_01;
  bool bVar1;
  char cVar2;
  type s;
  int iVar3;
  int iVar4;
  float_specs fVar5;
  appender *paVar6;
  char *s_00;
  size_t count;
  undefined8 in_RDX;
  long in_RSI;
  buffer<char> *in_RDI;
  buffer<char> *pbVar7;
  unkbyte10 in_ST0;
  longdouble in_stack_00000008;
  big_decimal_fp f;
  int exp;
  int precision;
  memory_buffer buffer;
  appender it;
  float_specs fspecs;
  format_specs<char> *in_stack_fffffffffffffc58;
  allocator<char> *alloc;
  undefined2 uVar8;
  undefined6 in_stack_fffffffffffffc62;
  format_specs<char> *in_stack_fffffffffffffc70;
  undefined2 in_stack_fffffffffffffc78;
  undefined2 uVar9;
  undefined2 in_stack_fffffffffffffc7a;
  undefined2 uVar10;
  undefined4 in_stack_fffffffffffffc7c;
  undefined4 uVar11;
  undefined6 in_stack_fffffffffffffc80;
  undefined6 uVar12;
  undefined2 in_stack_fffffffffffffc86;
  int in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  int iVar13;
  float_specs *in_stack_fffffffffffffcb8;
  double __x;
  undefined1 isnan;
  undefined8 in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  undefined5 uVar14;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffcd8;
  int local_300;
  basic_string_view<char> local_2f8;
  buffer<char> *local_2e8;
  ulong local_2e0;
  char local_2d5;
  allocator<char> local_2c1;
  buffer<char> local_2c0;
  buffer<char> *in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd7c;
  longdouble in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffdac;
  longdouble in_stack_fffffffffffffdb0;
  float_specs in_stack_fffffffffffffdc0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_90;
  char local_81;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_80;
  long local_78;
  undefined8 local_70;
  buffer<char> *local_68;
  undefined8 local_60;
  longdouble local_58;
  undefined8 local_38;
  undefined8 local_30;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_28;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_20;
  longdouble local_18;
  
  local_58 = in_stack_00000008;
  local_38 = in_RSI;
  local_30 = in_RDX;
  local_28.container = in_RDI;
  fVar5 = parse_float_type_spec<char>(in_stack_fffffffffffffc58);
  local_60._6_2_ = fVar5._6_2_;
  local_60._0_5_ = fVar5._0_5_;
  local_60 = CONCAT26(local_60._6_2_,CONCAT15(local_30._1_1_ >> 4,(undefined5)local_60)) &
             0xffff07ffffffffff;
  local_18 = local_58;
  __x = (double)local_58;
  bVar1 = std::signbit(__x);
  isnan = (undefined1)((ulong)__x >> 0x38);
  if (bVar1) {
    local_60._0_6_ = CONCAT15(1,(undefined5)local_60);
    local_58 = -local_58;
  }
  else if ((local_60._4_4_ >> 8 & 0xff) == 1) {
    local_60 = local_60 & 0xffff00ffffffffff;
  }
  alloc = SUB108(local_58,0);
  uVar8 = (undefined2)((unkuint10)local_58 >> 0x40);
  bVar1 = isfinite<long_double,_0>
                    ((longdouble)CONCAT28(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70));
  if (bVar1) {
    if ((((byte)((ulong)local_30 >> 8) & 0xf) == 4) && ((char)(local_60 >> 0x28) != '\0')) {
      paVar6 = reserve<fmt::v10::appender>((appender *)&local_28,1);
      local_80.container =
           (paVar6->super_back_insert_iterator<fmt::v10::detail::buffer<char>_>).container;
      local_81 = sign<char,fmt::v10::sign::type>((type)(local_60 >> 0x28));
      local_90.container = (buffer<char> *)appender::operator++((appender *)&local_80,0);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_90);
      std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
                ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
                 CONCAT62(in_stack_fffffffffffffc62,uVar8),(value_type_conflict1 *)alloc);
      local_28.container =
           (buffer<char> *)base_iterator<fmt::v10::appender>(local_28.container,local_80.container);
      local_60 = local_60 & 0xffff00ffffffffff;
      if ((int)local_38 != 0) {
        local_38 = CONCAT44(local_38._4_4_,(int)local_38 + -1);
      }
    }
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               CONCAT62(in_stack_fffffffffffffc62,uVar8),alloc);
    pbVar7 = (buffer<char> *)&local_2c1;
    std::allocator<char>::~allocator((allocator<char> *)pbVar7);
    cVar2 = (char)(local_60 >> 0x20);
    if (cVar2 == '\x03') {
      s = (type)(local_60 >> 0x28);
      if (s != none) {
        local_2d5 = sign<char,fmt::v10::sign::type>(s);
        pbVar7 = &local_2c0;
        buffer<char>::push_back
                  ((buffer<char> *)CONCAT62(in_stack_fffffffffffffc62,uVar8),(char *)alloc);
      }
      convert_float<long_double>((convert_float_result<long_double> *)pbVar7,local_58);
      local_2e0 = local_60;
      uVar8 = (undefined2)((unkuint10)in_ST0 >> 0x40);
      format_hexfloat<long_double,_0>
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffdc0,
                 (buffer<char> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      local_2e8 = local_28.container;
      s_00 = buffer<char>::data(&local_2c0);
      count = buffer<char>::size(&local_2c0);
      basic_string_view<char>::basic_string_view(&local_2f8,s_00,count);
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
           in_stack_fffffffffffffc8c;
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
           in_stack_fffffffffffffc88;
      bytes.data_._2_2_ = in_stack_fffffffffffffc7a;
      bytes.data_._0_2_ = in_stack_fffffffffffffc78;
      bytes.data_._4_4_ = in_stack_fffffffffffffc7c;
      bytes.size_._0_6_ = in_stack_fffffffffffffc80;
      bytes.size_._6_2_ = in_stack_fffffffffffffc86;
      local_20.container =
           (buffer<char> *)
           write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>
                     (out_00,bytes,in_stack_fffffffffffffc70);
    }
    else {
      iVar13 = local_38._4_4_;
      if ((local_38 < 0) && ((char)local_30 != '\0')) {
        iVar13 = 6;
      }
      if (cVar2 == '\x01') {
        in_stack_fffffffffffffc88 = iVar13;
        iVar4 = iVar13;
        iVar3 = max_value<int>();
        if (in_stack_fffffffffffffc88 == iVar3) {
          throw_format_error((char *)in_stack_fffffffffffffc70);
        }
        local_300 = iVar13 + 1;
        iVar13 = iVar4;
      }
      else {
        local_300 = iVar13;
        if ((cVar2 != '\x02') && (iVar13 == 0)) {
          local_300 = 1;
        }
      }
      convert_float<long_double>((convert_float_result<long_double> *)pbVar7,local_58);
      uVar11 = (undefined4)in_ST0;
      uVar12 = (undefined6)((unkuint10)in_ST0 >> 0x20);
      uVar8 = (undefined2)((unkuint10)in_ST0 >> 0x40);
      specs_01._4_4_ = in_stack_fffffffffffffda0;
      specs_01.precision = in_stack_fffffffffffffd9c;
      iVar4 = format_float<long_double>
                        (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,specs_01,
                         in_stack_fffffffffffffd70);
      uVar9 = (undefined2)iVar4;
      uVar10 = (undefined2)((uint)iVar4 >> 0x10);
      local_60 = CONCAT44(local_60._4_4_,local_300);
      pbVar7 = &local_2c0;
      buffer<char>::data(pbVar7);
      buffer<char>::size(pbVar7);
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ = iVar13;
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
           in_stack_fffffffffffffc88;
      fVar5._6_2_ = in_stack_fffffffffffffc86;
      fVar5._0_6_ = uVar12;
      loc_00.locale_._2_2_ = uVar10;
      loc_00.locale_._0_2_ = uVar9;
      loc_00.locale_._4_4_ = uVar11;
      local_20.container =
           (buffer<char> *)
           write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char>
                     (out_01,(big_decimal_fp *)in_stack_fffffffffffffc70,pbVar7,fVar5,loc_00);
    }
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               CONCAT62(in_stack_fffffffffffffc62,uVar8));
  }
  else {
    local_68 = local_28.container;
    isnan<long_double>(local_58);
    local_78 = local_38;
    local_70 = local_30;
    uVar14 = (undefined5)((ulong)in_stack_fffffffffffffcd0 >> 0x18);
    specs_00.type = (char)in_stack_fffffffffffffcd0;
    specs_00._9_2_ = (short)((ulong)in_stack_fffffffffffffcd0 >> 8);
    specs_00.fill.data_[0] = (char)uVar14;
    specs_00.fill.data_[1] = (char)((uint5)uVar14 >> 8);
    specs_00.fill.data_[2] = (char)((uint5)uVar14 >> 0x10);
    specs_00.fill.data_[3] = (char)((uint5)uVar14 >> 0x18);
    specs_00.fill.size_ = (char)((uint5)uVar14 >> 0x20);
    specs_00.width = (int)in_stack_fffffffffffffcc8;
    specs_00.precision = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    local_20.container =
         (buffer<char> *)
         write_nonfinite<char,fmt::v10::appender>
                   (in_stack_fffffffffffffcd8.container,(bool)isnan,specs_00,
                    in_stack_fffffffffffffcb8);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_20.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}